

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O3

bool GGWave_init(int playbackId,int captureId,int payloadLength,float sampleRateOffset,bool useDSS)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  SDL_AudioSpec playbackSpec;
  undefined1 local_7d;
  float local_7c;
  ggwave_Parameters local_78;
  int local_4c;
  GGWave *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((anonymous_namespace)::g_devIdInp == 0 || (anonymous_namespace)::g_devIdOut == 0) {
    local_7c = sampleRateOffset;
    local_4c = payloadLength;
    if ((anonymous_namespace)::g_devIdInp == 0 && (anonymous_namespace)::g_devIdOut == 0) {
      SDL_LogSetPriority(0,3);
      iVar3 = SDL_Init(0x10);
      if (iVar3 < 0) {
        uVar5 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar5);
        return true;
      }
      SDL_SetHintWithPriority("SDL_AUDIO_RESAMPLING_MODE","medium",2);
      uVar4 = SDL_GetNumAudioDevices(0);
      printf("Found %d playback devices:\n",(ulong)uVar4);
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          uVar5 = SDL_GetAudioDeviceName(uVar8,0);
          printf("    - Playback device #%d: \'%s\'\n",uVar8,uVar5);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar4 != uVar7);
      }
      uVar4 = SDL_GetNumAudioDevices(1);
      printf("Found %d capture devices:\n",(ulong)uVar4);
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          uVar5 = SDL_GetAudioDeviceName(uVar8,1);
          printf("    - Capture device #%d: \'%s\'\n",uVar8,uVar5);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar4 != uVar7);
      }
    }
    if ((anonymous_namespace)::g_devIdOut == 0) {
      puts("Initializing playback ...");
      SDL_memset(&local_78,0,0x20);
      local_78.payloadLength = (int)(local_7c + 48000.0);
      local_78.sampleRateInp._0_2_ = 0x8010;
      local_78.sampleRateInp._2_1_ = 1;
      local_78.sampleRateOut._0_2_ = 0x4000;
      local_78.samplesPerFrame = 0;
      local_78.soundMarkerThreshold = 0.0;
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecOut,0,0x20);
      if (playbackId < 0) {
        puts("Attempt to open default playback device ...");
        uVar5 = 0;
      }
      else {
        uVar5 = SDL_GetAudioDeviceName(playbackId,0);
        printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)(uint)playbackId,uVar5);
        uVar5 = SDL_GetAudioDeviceName(playbackId,0);
      }
      (anonymous_namespace)::g_devIdOut =
           SDL_OpenAudioDevice(uVar5,0,&local_78,&(anonymous_namespace)::g_obtainedSpecOut,0);
      bVar1 = (anonymous_namespace)::g_devIdOut != 0;
      if ((anonymous_namespace)::g_devIdOut == 0) {
        uVar5 = SDL_GetError();
        printf("Couldn\'t open an audio device for playback: %s!\n",uVar5);
        (anonymous_namespace)::g_devIdOut = 0;
      }
      else {
        printf("Obtained spec for output device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdOut);
        printf("    - Sample rate:       %d (required: %d)\n",
               (ulong)(anonymous_namespace)::g_obtainedSpecOut,(ulong)(uint)local_78.payloadLength);
        printf("    - Format:            %d (required: %d)\n",(ulong)DAT_0010722c,
               (ulong)local_78.sampleRateInp._0_2_);
        printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_0010722e,
               (ulong)local_78.sampleRateInp._2_1_);
        printf("    - Samples per frame: %d (required: %d)\n",(ulong)DAT_00107230,
               (ulong)local_78.sampleRateOut._0_2_);
        if (((DAT_0010722c != local_78.sampleRateInp._0_2_) ||
            (DAT_0010722e != local_78.sampleRateInp._2_1_)) ||
           (DAT_00107230 != local_78.sampleRateOut._0_2_)) {
          GGWave_init();
          goto LAB_00103696;
        }
      }
    }
    else {
      bVar1 = false;
    }
    if ((anonymous_namespace)::g_devIdInp == 0) {
      local_78.sampleRateInp._2_1_ = DAT_0010722e;
      local_78.sampleRateInp._3_1_ = uRam000000000010722f;
      local_78.sampleRateOut._2_2_ = (undefined2)uRam0000000000107232;
      local_78.sampleRate = (float)((uint6)uRam0000000000107232 >> 0x10);
      local_78.payloadLength = (int)(local_7c + 48000.0);
      local_78.samplesPerFrame = _DAT_00107238;
      local_78.soundMarkerThreshold = fRam000000000010723c;
      local_78.sampleFormatInp = gRam0000000000107240;
      local_78.sampleFormatOut = gRam0000000000107244;
      local_78.sampleRateInp._0_2_ = 0x8120;
      local_78.sampleRateOut._0_2_ = 0x400;
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecInp,0,0x20);
      if (captureId < 0) {
        puts("Attempt to open default capture device ...");
        lVar6 = _DAT_001071f8;
        if (_DAT_001071f8 != 0) {
          lVar6 = (anonymous_namespace)::g_defaultCaptureDeviceName_abi_cxx11_;
        }
      }
      else {
        uVar5 = SDL_GetAudioDeviceName(captureId,1);
        printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)(uint)captureId,uVar5);
        lVar6 = SDL_GetAudioDeviceName(captureId,1);
      }
      (anonymous_namespace)::g_devIdInp =
           SDL_OpenAudioDevice(lVar6,1,&local_78,&(anonymous_namespace)::g_obtainedSpecInp,0);
      if ((anonymous_namespace)::g_devIdInp == 0) {
        uVar5 = SDL_GetError();
        printf("Couldn\'t open an audio device for capture: %s!\n",uVar5);
        (anonymous_namespace)::g_devIdInp = 0;
      }
      else {
        printf("Obtained spec for input device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdInp);
        printf("    - Sample rate:       %d\n",(ulong)(anonymous_namespace)::g_obtainedSpecInp);
        printf("    - Format:            %d (required: %d)\n",(ulong)DAT_00107254,
               (ulong)local_78.sampleRateInp._0_2_);
        printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_00107256,
               (ulong)local_78.sampleRateInp._2_1_);
        printf("    - Samples per frame: %d\n",(ulong)DAT_00107258);
        bVar1 = true;
      }
    }
    local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    if (DAT_00107254 < 0x8010) {
      if (DAT_00107254 == 8) {
        local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U8;
      }
      else if (DAT_00107254 == 0x10) {
        local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U16;
      }
      else if (DAT_00107254 == 0x8008) {
        local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I8;
      }
    }
    else if (DAT_00107254 == 0x8010) {
      local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
    }
    else if ((DAT_00107254 == 0x8020) || (DAT_00107254 == 0x8120)) {
      local_78.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32;
    }
    local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    if (DAT_0010722c < 0x8010) {
      if (DAT_0010722c == 8) {
        local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U8;
      }
      else if (DAT_0010722c == 0x10) {
        local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U16;
      }
      else {
        local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
        if (DAT_0010722c == 0x8008) {
          local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I8;
        }
      }
    }
    else if (DAT_0010722c == 0x8010) {
      local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16;
    }
    else if ((DAT_0010722c == 0x8020) || (DAT_0010722c == 0x8120)) {
      local_78.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32;
    }
    bVar9 = true;
    if (bVar1) {
      local_78.operatingMode = (uint)useDSS << 4 | 6;
      local_78.payloadLength = local_4c;
      fVar10 = (float)(int)(anonymous_namespace)::g_obtainedSpecInp;
      local_78.sampleRateOut = (float)(int)(anonymous_namespace)::g_obtainedSpecOut;
      local_78.sampleRateInp._0_2_ = SUB42(fVar10,0);
      local_78.sampleRateInp._2_1_ = (byte)((uint)fVar10 >> 0x10);
      local_78.sampleRateInp._3_1_ = (undefined1)((uint)fVar10 >> 0x18);
      local_78.sampleRate = 48000.0;
      local_78.samplesPerFrame = 0x400;
      local_78.soundMarkerThreshold = 3.0;
      local_48 = (GGWave *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<GGWave,std::allocator<GGWave>,ggwave_Parameters>
                (a_Stack_40,&local_48,(allocator<GGWave> *)&local_7d,&local_78);
      _Var2._M_pi = a_Stack_40[0]._M_pi;
      (anonymous_namespace)::g_ggWave = local_48;
      this = DAT_00107218;
      local_48 = (GGWave *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      DAT_00107218 = _Var2._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
        }
      }
    }
  }
  else {
LAB_00103696:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool GGWave_init(
        const int playbackId,
        const int captureId,
        const int payloadLength,
        const float sampleRateOffset,
        const bool useDSS) {

    if (g_devIdInp && g_devIdOut) {
        return false;
    }

    if (g_devIdInp == 0 && g_devIdOut == 0) {
        SDL_LogSetPriority(SDL_LOG_CATEGORY_APPLICATION, SDL_LOG_PRIORITY_INFO);

        if (SDL_Init(SDL_INIT_AUDIO) < 0) {
            SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
            return (1);
        }

        SDL_SetHintWithPriority(SDL_HINT_AUDIO_RESAMPLING_MODE, "medium", SDL_HINT_OVERRIDE);

        {
            int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
            printf("Found %d playback devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
            }
        }
        {
            int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
            printf("Found %d capture devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
            }
        }
    }

    bool reinit = false;

    if (g_devIdOut == 0) {
        printf("Initializing playback ...\n");

        SDL_AudioSpec playbackSpec;
        SDL_zero(playbackSpec);

        playbackSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        playbackSpec.format = AUDIO_S16SYS;
        playbackSpec.channels = 1;
        playbackSpec.samples = 16*1024;
        playbackSpec.callback = NULL;

        SDL_zero(g_obtainedSpecOut);

        if (playbackId >= 0) {
            printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
            g_devIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        } else {
            printf("Attempt to open default playback device ...\n");
            g_devIdOut = SDL_OpenAudioDevice(NULL, SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        }

        if (!g_devIdOut) {
            printf("Couldn't open an audio device for playback: %s!\n", SDL_GetError());
            g_devIdOut = 0;
        } else {
            printf("Obtained spec for output device (SDL Id = %d):\n", g_devIdOut);
            printf("    - Sample rate:       %d (required: %d)\n", g_obtainedSpecOut.freq, playbackSpec.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecOut.format, playbackSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecOut.channels, playbackSpec.channels);
            printf("    - Samples per frame: %d (required: %d)\n", g_obtainedSpecOut.samples, playbackSpec.samples);

            if (g_obtainedSpecOut.format != playbackSpec.format ||
                g_obtainedSpecOut.channels != playbackSpec.channels ||
                g_obtainedSpecOut.samples != playbackSpec.samples) {
                g_devIdOut = 0;
                SDL_CloseAudio();
                fprintf(stderr, "Failed to initialize playback SDL_OpenAudio!");

                return false;
            }

            reinit = true;
        }
    }

    if (g_devIdInp == 0) {
        SDL_AudioSpec captureSpec;
        captureSpec = g_obtainedSpecOut;
        captureSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        captureSpec.format = AUDIO_F32SYS;
        captureSpec.samples = 1024;

        SDL_zero(g_obtainedSpecInp);

        if (captureId >= 0) {
            printf("Attempt to open capture device %d : '%s' ...\n", captureId, SDL_GetAudioDeviceName(captureId, SDL_TRUE));
            g_devIdInp = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        } else {
            printf("Attempt to open default capture device ...\n");
            g_devIdInp = SDL_OpenAudioDevice(g_defaultCaptureDeviceName.empty() ? nullptr : g_defaultCaptureDeviceName.c_str(),
                                            SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        }
        if (!g_devIdInp) {
            printf("Couldn't open an audio device for capture: %s!\n", SDL_GetError());
            g_devIdInp = 0;
        } else {
            printf("Obtained spec for input device (SDL Id = %d):\n", g_devIdInp);
            printf("    - Sample rate:       %d\n", g_obtainedSpecInp.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecInp.format, captureSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecInp.channels, captureSpec.channels);
            printf("    - Samples per frame: %d\n", g_obtainedSpecInp.samples);

            reinit = true;
        }
    }

    GGWave::SampleFormat sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    GGWave::SampleFormat sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;

    switch (g_obtainedSpecInp.format) {
        case AUDIO_U8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
    }

    switch (g_obtainedSpecOut.format) {
        case AUDIO_U8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
            break;
    }

    if (reinit) {
        GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_RX_AND_TX;
        if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

        g_ggWave = std::make_shared<GGWave>(GGWave::Parameters {
            payloadLength,
            (float) g_obtainedSpecInp.freq,
            (float) g_obtainedSpecOut.freq,
            GGWave::kDefaultSampleRate,
            GGWave::kDefaultSamplesPerFrame,
            GGWave::kDefaultSoundMarkerThreshold,
            sampleFormatInp,
            sampleFormatOut,
            mode,
        });
    }

    return true;
}